

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputClearUpdate(HelicsInput inp)

{
  HelicsInput pvVar1;
  
  pvVar1 = (HelicsInput)0x0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    pvVar1 = inp;
  }
  if (pvVar1 != (HelicsInput)0x0) {
    helics::Input::clearUpdate(*(Input **)((long)pvVar1 + 0x18));
  }
  return;
}

Assistant:

void helicsInputClearUpdate(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->clearUpdate();
    }
    // LCOV_EXCL_START
    catch (...) {
        ;
    }
    // LCOV_EXCL_STOP
}